

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QObject * parentObject(QObject *obj)

{
  int iVar1;
  QLabel *pQVar2;
  char *pcVar3;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QObject *p;
  QVariant *in_stack_ffffffffffffffb0;
  QObject *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = qobject_cast<QLabel_const*>((QObject *)0x4277d1);
  if (pQVar2 != (QLabel *)0x0) {
    (**(code **)*in_RDI)();
    pcVar3 = (char *)QMetaObject::className();
    iVar1 = qstrcmp(pcVar3,"QTipLabel");
    if (iVar1 == 0) {
      QObject::property((char *)&local_28);
      local_30 = qvariant_cast<QObject*>(in_stack_ffffffffffffffb0);
      QVariant::~QVariant(&local_28);
      if (local_30 != (QObject *)0x0) goto LAB_0042785b;
    }
  }
  local_30 = QObject::parent((QObject *)0x427856);
LAB_0042785b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

static inline QObject *parentObject(const QObject *obj)
{
#if QT_CONFIG(tooltip)
    if (qobject_cast<const QLabel *>(obj) && qstrcmp(obj->metaObject()->className(), "QTipLabel") == 0) {
        QObject *p = qvariant_cast<QObject *>(obj->property("_q_stylesheet_parent"));
        if (p)
            return p;
    }
#endif
    return obj->parent();
}